

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testStandardAttributes.cpp
# Opt level: O0

void anon_unknown.dwarf_2278eb::writeReadRational(char *fileName)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  char *name;
  Rational *b;
  Rational *b_00;
  Header *in_RDI;
  Rational *r4;
  Rational *r3;
  RgbaInputFile in;
  int i;
  Rgba pixels [100];
  RgbaOutputFile out;
  Header header;
  Rational r2;
  Rational r1;
  float in_stack_fffffffffffffb4c;
  half *in_stack_fffffffffffffb50;
  Header *pHVar4;
  Rgba *local_458;
  RgbaInputFile local_410 [68];
  int local_3cc;
  Rgba local_3c8 [100];
  Rgba RStack_a8;
  Rgba local_a0 [3];
  Rational local_88 [4];
  Rational local_68 [2];
  Vec2<float> local_58;
  Header local_50 [56];
  Rational local_18;
  Rational local_10;
  Header *local_8;
  
  local_8 = in_RDI;
  poVar3 = std::operator<<((ostream *)&std::cout,"rational attribute");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::operator<<((ostream *)&std::cout,"writing, ");
  Imf_3_4::Rational::Rational(&local_10,0xc,0x11);
  Imf_3_4::Rational::Rational(&local_18,-0xc,3);
  Imath_3_2::Vec2<float>::Vec2(&local_58,0.0,0.0);
  Imf_3_4::Header::Header(local_50,100,100,1.0,(Vec2 *)&local_58,1.0,INCREASING_Y,ZIP_COMPRESSION);
  Imf_3_4::TypedAttribute<Imf_3_4::Rational>::TypedAttribute(local_68);
  Imf_3_4::Header::insert((char *)local_50,(Attribute *)0x2257bf);
  Imf_3_4::TypedAttribute<Imf_3_4::Rational>::~TypedAttribute
            ((TypedAttribute<Imf_3_4::Rational> *)local_68);
  Imf_3_4::TypedAttribute<Imf_3_4::Rational>::TypedAttribute(local_88);
  Imf_3_4::Header::insert((char *)local_50,(Attribute *)0x2257eb);
  Imf_3_4::TypedAttribute<Imf_3_4::Rational>::~TypedAttribute
            ((TypedAttribute<Imf_3_4::Rational> *)local_88);
  pHVar4 = local_8;
  iVar2 = Imf_3_4::globalThreadCount();
  Imf_3_4::RgbaOutputFile::RgbaOutputFile
            ((RgbaOutputFile *)local_a0,(char *)pHVar4,local_50,WRITE_RGBA,iVar2);
  local_458 = local_3c8;
  do {
    Imf_3_4::Rgba::Rgba(local_458);
    local_458 = local_458 + 1;
  } while (local_458 != &RStack_a8);
  for (local_3cc = 0; local_3cc < 100; local_3cc = local_3cc + 1) {
    Imath_3_2::half::operator=(in_stack_fffffffffffffb50,in_stack_fffffffffffffb4c);
    Imath_3_2::half::operator=(in_stack_fffffffffffffb50,in_stack_fffffffffffffb4c);
    Imath_3_2::half::operator=(in_stack_fffffffffffffb50,in_stack_fffffffffffffb4c);
    Imath_3_2::half::operator=(in_stack_fffffffffffffb50,in_stack_fffffffffffffb4c);
  }
  Imf_3_4::RgbaOutputFile::setFrameBuffer(local_a0,(ulong)local_3c8,1);
  Imf_3_4::RgbaOutputFile::writePixels((int)local_a0);
  Imf_3_4::RgbaOutputFile::~RgbaOutputFile((RgbaOutputFile *)local_a0);
  poVar3 = std::operator<<((ostream *)&std::cout,"reading, comparing");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  pHVar4 = local_8;
  iVar2 = Imf_3_4::globalThreadCount();
  Imf_3_4::RgbaInputFile::RgbaInputFile(local_410,(char *)pHVar4,iVar2);
  name = (char *)Imf_3_4::RgbaInputFile::header();
  Imf_3_4::Header::typedAttribute<Imf_3_4::TypedAttribute<Imf_3_4::Rational>>(pHVar4,name);
  b = (Rational *)Imf_3_4::TypedAttribute<Imf_3_4::Rational>::value();
  Imf_3_4::RgbaInputFile::header();
  Imf_3_4::Header::typedAttribute<Imf_3_4::TypedAttribute<Imf_3_4::Rational>>(pHVar4,name);
  b_00 = (Rational *)Imf_3_4::TypedAttribute<Imf_3_4::Rational>::value();
  bVar1 = equal(&local_10,b);
  if (!bVar1) {
    __assert_fail("equal (r1, r3)",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                  ,0x33d,"void (anonymous namespace)::writeReadRational(const char *)");
  }
  bVar1 = equal(&local_18,b_00);
  if (!bVar1) {
    __assert_fail("equal (r2, r4)",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                  ,0x33e,"void (anonymous namespace)::writeReadRational(const char *)");
  }
  Imf_3_4::RgbaInputFile::~RgbaInputFile(local_410);
  remove((char *)local_8);
  Imf_3_4::Header::~Header(local_50);
  return;
}

Assistant:

void
writeReadRational (const char fileName[])
{
    cout << "rational attribute" << endl;

    cout << "writing, ";

    Rational r1 (12, 17);
    Rational r2 (-12, 3);

    static const int W = 100;
    static const int H = 100;

    Header header (W, H);
    header.insert ("r1", RationalAttribute (r1));
    header.insert ("r2", RationalAttribute (r2));

    {
        RgbaOutputFile out (fileName, header);
        Rgba           pixels[W];

        for (int i = 0; i < W; ++i)
        {
            pixels[i].r = 1;
            pixels[i].g = 1;
            pixels[i].b = 1;
            pixels[i].a = 1;
        }

        out.setFrameBuffer (pixels, 1, 0);
        out.writePixels (H);
    }

    cout << "reading, comparing" << endl;

    {
        RgbaInputFile in (fileName);

        const Rational& r3 =
            in.header ().typedAttribute<RationalAttribute> ("r1").value ();

        const Rational& r4 =
            in.header ().typedAttribute<RationalAttribute> ("r2").value ();

        assert (equal (r1, r3));
        assert (equal (r2, r4));
    }

    remove (fileName);
}